

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

nh_bool nh_set_option(char *name,nh_optvalue value,boolean isstring)

{
  int iVar1;
  bool bVar2;
  boolean rv;
  boolean isstring_local;
  char *name_local;
  nh_optvalue value_local;
  
  iVar1 = exit_jmp_buf_valid + 1;
  bVar2 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar1;
  if ((bVar2) && (iVar1 = __sigsetjmp(exit_jmp_buf,1), iVar1 != 0)) {
    value_local._7_1_ = 0;
  }
  else {
    value_local._7_1_ = set_option(name,value,isstring);
    exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  }
  return value_local._7_1_;
}

Assistant:

boolean nh_set_option(const char *name, union nh_optvalue value, boolean isstring)
{
	boolean rv;
	
	if (!api_entry_checkpoint())
	    return FALSE;
	
	rv = set_option(name, value, isstring);
	
	api_exit();
	return rv;
}